

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O2

LispPTR CHAR_bouts(LispPTR *args)

{
  DLword *pDVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  LispPTR *pLVar5;
  int *piVar6;
  ssize_t x;
  LispPTR LVar7;
  void *page;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    uVar4 = *args;
    if ((uVar4 & 0xfff0000) == 0xf0000) {
      LVar7 = uVar4 | 0xffff0000;
    }
    else if ((uVar4 & 0xfff0000) == 0xe0000) {
      LVar7 = uVar4 & 0xffff;
    }
    else {
      pLVar5 = NativeAligned4FromLAddr(uVar4);
      LVar7 = *pLVar5;
    }
    pDVar1 = Lisp_world;
    uVar4 = args[1];
    uVar3 = args[2];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      uVar3 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      uVar3 = uVar3 & 0xffff;
    }
    else {
      pLVar5 = NativeAligned4FromLAddr(uVar3);
      uVar3 = *pLVar5;
    }
    page = (void *)((long)pDVar1 + (ulong)uVar3 + (ulong)uVar4 * 2);
    uVar4 = args[3];
    if ((uVar4 & 0xfff0000) == 0xf0000) {
      uVar4 = uVar4 | 0xffff0000;
    }
    else if ((uVar4 & 0xfff0000) == 0xe0000) {
      uVar4 = uVar4 & 0xffff;
    }
    else {
      pLVar5 = NativeAligned4FromLAddr(uVar4);
      uVar4 = *pLVar5;
    }
    uVar3 = (int)(uVar4 + 3) >> 2;
    word_swap_page(page,uVar3);
    alarm(TIMEOUT_TIME);
    piVar6 = __errno_location();
    do {
      *piVar6 = 0;
      x = write(LVar7,page,(long)(int)uVar4);
      if (x != -1) {
        alarm(0);
        word_swap_page(page,uVar3);
        if (x == 0) {
          *Lisp_errno = 0xb;
          return 0;
        }
        LVar7 = GetSmallp(x);
        return LVar7;
      }
    } while (*piVar6 == 4);
    alarm(0);
    word_swap_page(page,uVar3);
    *Lisp_errno = *piVar6;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR CHAR_bouts(LispPTR *args)
{
#ifndef DOS
  int fd;
  ssize_t rval;
  char *buffer;
  int nbytes;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);
  ERRSETJMP(NIL);
  fd = LispNumToCInt(args[0]);
  buffer = ((char *)(NativeAligned2FromLAddr(args[1]))) + LispNumToCInt(args[2]);
  nbytes = LispNumToCInt(args[3]);
/* Write PAGE_SIZE bytes file contents from filepointer. */
#ifdef BYTESWAP
  word_swap_page((unsigned short *)buffer, (nbytes + 3) >> 2);
#endif /* BYTESWAP */

  TIMEOUT(rval = write(fd, buffer, nbytes));
#ifdef BYTESWAP
  word_swap_page((unsigned short *)buffer, (nbytes + 3) >> 2);
#endif /* BYTESWAP */

  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  if (rval == 0) {
    *Lisp_errno = EWOULDBLOCK;
    return (NIL);
  }
  return (GetSmallp(rval));
#endif /* DOS */
}